

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  Arena *pAVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  MessageOptions *pMVar5;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  FieldDescriptorProto *pFVar6;
  FieldDescriptor *pFVar7;
  OneofDescriptor *pOVar8;
  string *psVar9;
  char *pcVar10;
  OneofDescriptorProto *descriptor;
  FieldDescriptor **ppFVar11;
  OneofOptions *pOVar12;
  long lVar13;
  long lVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  SubstituteArg *in_stack_fffffffffffffc58;
  Rep *pRVar15;
  OneofDescriptor *mutable_oneof_decl;
  OneofDescriptor *oneof_decl_2;
  undefined1 local_2e0 [4];
  int i_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  Rep *local_2a0;
  OneofDescriptor *oneof_decl_1;
  undefined1 local_290 [4];
  int i_5;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  OneofDescriptor *local_40;
  OneofDescriptor *oneof_decl;
  int local_30;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  _i_1 = proto;
  proto_local = (DescriptorProto *)message;
  message_local = (Descriptor *)this;
  if (*(long *)(message + 0x20) == 0) {
    pMVar5 = MessageOptions::default_instance();
    *(MessageOptions **)&(proto_local->field_).super_RepeatedPtrFieldBase.current_size_ = pMVar5;
  }
  i_2 = 0;
  while( true ) {
    iVar4 = i_2;
    iVar3 = Descriptor::nested_type_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    lVar14 = *(long *)&(proto_local->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    lVar13 = (long)i_2;
    proto_00 = DescriptorProto::nested_type(_i_1,i_2);
    CrossLinkMessage(this,(Descriptor *)(lVar14 + lVar13 * 0xa8),proto_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar4 = i_3;
    iVar3 = Descriptor::enum_type_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    pAVar1 = (proto_local->extension_range_).super_RepeatedPtrFieldBase.arena_;
    lVar14 = (long)i_3;
    proto_01 = DescriptorProto::enum_type(_i_1,i_3);
    CrossLinkEnum(this,(EnumDescriptor *)(pAVar1 + lVar14 * 0x38),proto_01);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar4 = i_4;
    iVar3 = Descriptor::field_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    pAVar1 = (proto_local->nested_type_).super_RepeatedPtrFieldBase.arena_;
    lVar14 = (long)i_4;
    pFVar6 = DescriptorProto::field(_i_1,i_4);
    CrossLinkField(this,(FieldDescriptor *)(pAVar1 + lVar14 * 0xa8),pFVar6);
    i_4 = i_4 + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar4 = local_30;
    iVar3 = Descriptor::extension_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    lVar14 = *(long *)&(proto_local->extension_).super_RepeatedPtrFieldBase.current_size_;
    lVar13 = (long)local_30;
    pFVar6 = DescriptorProto::extension(_i_1,local_30);
    CrossLinkField(this,(FieldDescriptor *)(lVar14 + lVar13 * 0xa8),pFVar6);
    local_30 = local_30 + 1;
  }
  oneof_decl._4_4_ = 0;
  while( true ) {
    uVar2 = oneof_decl._4_4_;
    iVar4 = Descriptor::field_count((Descriptor *)proto_local);
    if (iVar4 <= (int)uVar2) break;
    psVar9 = (string *)(ulong)oneof_decl._4_4_;
    pFVar7 = Descriptor::field((Descriptor *)proto_local,oneof_decl._4_4_);
    local_40 = FieldDescriptor::containing_oneof(pFVar7);
    if (local_40 != (OneofDescriptor *)0x0) {
      iVar3 = OneofDescriptor::field_count(local_40);
      iVar4 = extraout_EDX;
      if (0 < iVar3) {
        psVar9 = (string *)(ulong)(oneof_decl._4_4_ - 1);
        pFVar7 = Descriptor::field((Descriptor *)proto_local,oneof_decl._4_4_ - 1);
        pOVar8 = FieldDescriptor::containing_oneof(pFVar7);
        iVar4 = extraout_EDX_00;
        if (pOVar8 != local_40) {
          psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
          std::operator+(&local_80,psVar9,".");
          pFVar7 = Descriptor::field((Descriptor *)proto_local,oneof_decl._4_4_ - 1);
          psVar9 = FieldDescriptor::name_abi_cxx11_(pFVar7);
          std::operator+(&local_60,&local_80,psVar9);
          pFVar6 = DescriptorProto::field(_i_1,oneof_decl._4_4_ - 1);
          pFVar7 = Descriptor::field((Descriptor *)proto_local,oneof_decl._4_4_ - 1);
          psVar9 = FieldDescriptor::name_abi_cxx11_(pFVar7);
          strings::internal::SubstituteArg::SubstituteArg(&local_e0,psVar9);
          psVar9 = OneofDescriptor::name_abi_cxx11_(local_40);
          strings::internal::SubstituteArg::SubstituteArg(&local_110,psVar9);
          strings::internal::SubstituteArg::SubstituteArg(&local_140);
          strings::internal::SubstituteArg::SubstituteArg(&local_170);
          strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
          strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
          strings::internal::SubstituteArg::SubstituteArg(&local_200);
          strings::internal::SubstituteArg::SubstituteArg(&local_230);
          strings::internal::SubstituteArg::SubstituteArg(&local_260);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_290);
          strings::Substitute_abi_cxx11_
                    (&local_b0,
                     (strings *)
                     "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                     ,(char *)&local_e0,&local_110,&local_140,&local_170,&local_1a0,&local_1d0,
                     &local_200,&local_230,&local_260,(SubstituteArg *)local_290,
                     in_stack_fffffffffffffc58);
          psVar9 = &local_60;
          AddError(this,psVar9,&pFVar6->super_Message,OTHER,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_80);
          iVar4 = extraout_EDX_01;
        }
      }
      pRVar15 = (proto_local->nested_type_).super_RepeatedPtrFieldBase.rep_;
      pcVar10 = OneofDescriptor::index(local_40,(char *)psVar9,iVar4);
      *(int *)((long)pRVar15[(long)(int)pcVar10 * 3 + 1].elements + 4) =
           *(int *)((long)pRVar15[(long)(int)pcVar10 * 3 + 1].elements + 4) + 1;
    }
    oneof_decl._4_4_ = oneof_decl._4_4_ + 1;
  }
  oneof_decl_1._4_4_ = 0;
  while( true ) {
    iVar4 = oneof_decl_1._4_4_;
    iVar3 = Descriptor::oneof_decl_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    local_2a0 = (proto_local->nested_type_).super_RepeatedPtrFieldBase.rep_ +
                (long)oneof_decl_1._4_4_ * 3;
    iVar4 = OneofDescriptor::field_count((OneofDescriptor *)local_2a0);
    if (iVar4 == 0) {
      psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     psVar9,".");
      psVar9 = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)local_2a0);
      std::operator+(&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     psVar9);
      descriptor = DescriptorProto::oneof_decl(_i_1,oneof_decl_1._4_4_);
      AddError(this,&local_2c0,&descriptor->super_Message,NAME,"Oneof must have at least one field."
              );
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)local_2e0);
    }
    ppFVar11 = DescriptorPool::Tables::AllocateArray<google::protobuf::FieldDescriptor_const*>
                         (this->tables_,*(int *)((long)local_2a0[1].elements + 4));
    *(FieldDescriptor ***)(local_2a0 + 2) = ppFVar11;
    *(undefined4 *)((long)local_2a0[1].elements + 4) = 0;
    if (local_2a0[2].elements[0] == (void *)0x0) {
      pOVar12 = OneofOptions::default_instance();
      local_2a0[2].elements[0] = pOVar12;
    }
    oneof_decl_1._4_4_ = oneof_decl_1._4_4_ + 1;
  }
  oneof_decl_2._4_4_ = 0;
  while( true ) {
    iVar4 = Descriptor::field_count((Descriptor *)proto_local);
    if (iVar4 <= (int)oneof_decl_2._4_4_) break;
    pcVar10 = (char *)(ulong)oneof_decl_2._4_4_;
    pFVar7 = Descriptor::field((Descriptor *)proto_local,oneof_decl_2._4_4_);
    pOVar8 = FieldDescriptor::containing_oneof(pFVar7);
    if (pOVar8 != (OneofDescriptor *)0x0) {
      pRVar15 = (proto_local->nested_type_).super_RepeatedPtrFieldBase.rep_;
      pcVar10 = OneofDescriptor::index(pOVar8,pcVar10,__c);
      iVar3 = (int)pcVar10;
      *(undefined4 *)
       ((proto_local->nested_type_).super_RepeatedPtrFieldBase.arena_ +
       (long)(int)oneof_decl_2._4_4_ * 0xa8 + 0x54) =
           *(undefined4 *)((long)pRVar15[(long)iVar3 * 3 + 1].elements + 4);
      pFVar7 = Descriptor::field((Descriptor *)proto_local,oneof_decl_2._4_4_);
      lVar14 = *(long *)(pRVar15 + (long)iVar3 * 3 + 2);
      iVar4 = *(int *)((long)pRVar15[(long)iVar3 * 3 + 1].elements + 4);
      *(int *)((long)pRVar15[(long)iVar3 * 3 + 1].elements + 4) = iVar4 + 1;
      *(FieldDescriptor **)(lVar14 + (long)iVar4 * 8) = pFVar7;
    }
    oneof_decl_2._4_4_ = oneof_decl_2._4_4_ + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(
    Descriptor* message, const DescriptorProto& proto) {
  if (message->options_ == NULL) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != NULL) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(
            message->full_name() + "." + message->field(i - 1)->name(),
            proto.field(i - 1), DescriptorPool::ErrorCollector::OTHER,
            strings::Substitute(
                "Fields in the same oneof must be defined consecutively. "
                "\"$0\" cannot be defined before the completion of the "
                "\"$1\" oneof definition.",
                message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i),
               DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ =
      tables_->AllocateArray<const FieldDescriptor*>(oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == NULL) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != NULL) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }
}